

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CY.hpp
# Opt level: O2

bool __thiscall
qclab::qgates::CY<std::complex<float>_>::equals
          (CY<std::complex<float>_> *this,QObject<std::complex<float>_> *other)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  
  plVar4 = (long *)__dynamic_cast(other,&QObject<std::complex<float>>::typeinfo,
                                  &CY<std::complex<float>>::typeinfo,0);
  if ((plVar4 != (long *)0x0) &&
     (*(int *)((long)plVar4 + 0xc) ==
      (this->super_QControlledGate2<std::complex<float>_>).controlState_)) {
    lVar1 = plVar4[1];
    iVar2 = (**(code **)(*plVar4 + 0x78))(plVar4);
    if (((int)lVar1 < iVar2) &&
       (iVar2 = (this->super_QControlledGate2<std::complex<float>_>).control_,
       iVar3 = (*(this->super_QControlledGate2<std::complex<float>_>).
                 super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                 _vptr_QObject[0xf])(this), iVar2 < iVar3)) {
      return true;
    }
    lVar1 = plVar4[1];
    iVar2 = (**(code **)(*plVar4 + 0x78))(plVar4);
    if (iVar2 < (int)lVar1) {
      iVar2 = (this->super_QControlledGate2<std::complex<float>_>).control_;
      iVar3 = (*(this->super_QControlledGate2<std::complex<float>_>).
                super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject
                [0xf])(this);
      return iVar3 < iVar2;
    }
  }
  return false;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using CG = CY< T > ;
          if ( const CG* p = dynamic_cast< const CG* >( &other ) ) {
            if ( p->controlState() != this->controlState() ) return false ;
            return ( ( p->control() < p->target() ) &&
                     ( this->control() < this->target() ) ) ||
                   ( ( p->control() > p->target() ) &&
                     ( this->control() > this->target() ) ) ;
          }
          return false ;
        }